

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void __thiscall unittest::UnitTest::TestMixedComment(UnitTest *this)

{
  int iVar1;
  mapped_type *this_00;
  mapped_type *a;
  allocator<char> local_26b;
  allocator<char> local_26a;
  allocator<char> local_269;
  key_type local_268;
  shared_ptr<MixedFormat> fmt;
  key_type local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  __shared_ptr<inipp::Format<char>,(__gnu_cxx::_Lock_policy)2> local_1f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  Ini<char> ini;
  istringstream ss;
  
  std::make_shared<MixedFormat>();
  std::__shared_ptr<inipp::Format<char>,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<MixedFormat,void>
            (local_1f8,&fmt.super___shared_ptr<MixedFormat,_(__gnu_cxx::_Lock_policy)2>);
  inipp::Ini<char>::Ini(&ini,(shared_ptr<inipp::Format<char>_> *)local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0);
  iVar1 = (*(ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_Format[3])
                    (ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,0x23);
  Assert::IsTrue(SUB41(iVar1,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"# hello world\n; hello world\n\' hello world\n[default]\na=2",
             (allocator<char> *)&local_238);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&local_268,_S_in);
  std::__cxx11::string::~string((string *)&local_268);
  inipp::Ini<char>::parse(&ini,(basic_istream<char,_std::char_traits<char>_> *)&ss);
  WriteMessage<char>(&ini);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"default",&local_269);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::at(&ini.sections,&local_268);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"a",&local_26a);
  a = std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at(this_00,&local_238);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"2",&local_26b);
  Assert::AreEqual<std::__cxx11::string>(a,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_268);
  Assert::IsTrue(ini.errors.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&ini.errors);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  inipp::Ini<char>::~Ini(&ini);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fmt.super___shared_ptr<MixedFormat,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST_METHOD(TestMixedComment)
		{
			auto fmt = std::make_shared<MixedFormat>();
			Ini<char> ini(fmt);
			Assert::IsTrue(ini.format->is_comment('#'));
			std::istringstream ss("# hello world\n; hello world\n' hello world\n[default]\na=2");
			ini.parse(ss);
			WriteMessage(ini);
			Assert::AreEqual(ini.sections.at("default").at("a"), std::string("2"));
			Assert::IsTrue(ini.errors.empty());
		}